

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O1

ostream * wasm::String::unescapeUTF8JSONtoWTF16(ostream *os,char *str)

{
  char cVar1;
  byte bVar2;
  long lVar3;
  Fatal local_348;
  undefined1 local_1c0 [8];
  stringstream unhex;
  long local_1b0 [3];
  uint auStack_198 [22];
  ios_base local_140 [268];
  uint32_t local_34;
  uint x;
  
  lVar3 = 0;
LAB_00c3f97f:
  do {
    for (; cVar1 = str[lVar3], cVar1 != '\\'; lVar3 = lVar3 + 1) {
      if (cVar1 == '\0') {
        return os;
      }
      writeWTF16CodePoint(os,(int)cVar1);
    }
    bVar2 = str[lVar3 + 1];
    if (bVar2 < 0x6e) {
      if (bVar2 == 0x62) {
        bVar2 = 8;
      }
      else if (bVar2 == 0x66) {
        bVar2 = 0xc;
      }
      else if (bVar2 == 0) {
        Fatal::Fatal((Fatal *)local_1c0);
        Fatal::operator<<((Fatal *)local_1c0,(char (*) [35])"Invalid escaped JSON ends in slash");
        Fatal::~Fatal((Fatal *)local_1c0);
      }
      goto switchD_00c3f9c5_caseD_6f;
    }
    switch(bVar2) {
    case 0x6e:
      bVar2 = 10;
      break;
    case 0x72:
      bVar2 = 0xd;
      break;
    case 0x74:
      bVar2 = 9;
      break;
    case 0x75:
      goto switchD_00c3f9c5_caseD_75;
    }
switchD_00c3f9c5_caseD_6f:
    writeWTF16CodePoint(os,(int)(char)bVar2);
    lVar3 = lVar3 + 2;
  } while( true );
switchD_00c3f9c5_caseD_75:
  std::__cxx11::stringstream::stringstream((stringstream *)local_1c0);
  if ((((str[lVar3 + 2] == '\0') || (str[lVar3 + 3] == '\0')) || (str[lVar3 + 4] == '\0')) ||
     (str[lVar3 + 5] == '\0')) {
    Fatal::Fatal(&local_348);
    Fatal::operator<<(&local_348,(char (*) [28])"Invalid escaped JSON \\uXXXX");
    Fatal::~Fatal(&local_348);
  }
  *(uint *)((long)auStack_198 + *(long *)(local_1b0[0] + -0x18)) =
       *(uint *)((long)auStack_198 + *(long *)(local_1b0[0] + -0x18)) & 0xffffffb5 | 8;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,str + lVar3 + 2,4);
  std::istream::_M_extract<unsigned_int>((uint *)local_1c0);
  writeWTF16CodePoint(os,local_34);
  lVar3 = lVar3 + 6;
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1c0);
  std::ios_base::~ios_base(local_140);
  goto LAB_00c3f97f;
}

Assistant:

std::ostream& unescapeUTF8JSONtoWTF16(std::ostream& os, const char* str) {
  size_t i = 0;
  while (str[i]) {
    if (str[i] != '\\') {
      // Normal character.
      writeWTF16CodePoint(os, str[i]);
      i++;
      continue;
    }

    // Escaped character.
    char c = str[i + 1];
    if (c != 'u') {
      switch (c) {
        case 'b':
          c = '\b';
          break;
        case 'f':
          c = '\f';
          break;
        case 'n':
          c = '\n';
          break;
        case 'r':
          c = '\r';
          break;
        case 't':
          c = '\t';
          break;
        case 0:
          Fatal() << "Invalid escaped JSON ends in slash";
      }
      writeWTF16CodePoint(os, c);
      i += 2;
      continue;
    }

    // \uXXXX, 4-digit hex number. First, read the hex.
    unsigned int x;
    std::stringstream unhex;
    if (!str[i + 2] || !str[i + 3] || !str[i + 4] || !str[i + 5]) {
      Fatal() << "Invalid escaped JSON \\uXXXX";
    }
    unhex << std::hex << std::string_view(str + i + 2, 4);
    unhex >> x;

    // Write out the results.
    writeWTF16CodePoint(os, x);

    i += 6;
  }

  return os;
}